

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                  *this)

{
  BinaryReader<mp::internal::IdentityConverter> *pBVar1;
  byte *pbVar2;
  bool bVar3;
  int opcode;
  ExprBase EVar4;
  undefined8 local_28;
  undefined8 uStack_20;
  ArgList local_18;
  
  pBVar1 = this->reader_;
  pbVar2 = (byte *)(pBVar1->super_BinaryReaderBase).super_ReaderBase.ptr_;
  (pBVar1->super_BinaryReaderBase).super_ReaderBase.token_ = (char *)pbVar2;
  (pBVar1->super_BinaryReaderBase).super_ReaderBase.ptr_ = (char *)(pbVar2 + 1);
  bVar3 = true;
  EVar4.impl_ = (Impl *)(ulong)(*pbVar2 - 0x6c);
  switch(EVar4.impl_) {
  case (Impl *)0x0:
  case (Impl *)0x2:
  case (Impl *)0x7:
    ReadConstant(this,*pbVar2);
    EVar4.impl_ = (Impl *)0x0;
    break;
  default:
    goto switchD_0033bdd6_caseD_1;
  case (Impl *)0x3:
    opcode = ReadOpCode(this);
    EVar4.impl_ = (Impl *)ReadLogicalExpr(this,opcode);
  }
  bVar3 = false;
switchD_0033bdd6_caseD_1:
  if (bVar3) {
    local_28 = 0;
    uStack_20 = 0;
    local_18.types_ = 0;
    local_18.field_1.values_ = (Value *)&local_28;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x3920e9,&local_18);
    EVar4.impl_ = (Impl *)0x0;
  }
  return (LogicalExpr)EVar4.impl_;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}